

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_sign(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  int iVar1;
  Tcl_Obj **objv_local;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  iVar1 = tclpkcs11_perform_pki_sign(cd,interp,objc,objv);
  return iVar1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_sign(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "SIGN START\n");
  return(tclpkcs11_perform_pki_sign(cd, interp, objc, objv));
}